

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdReport.cpp
# Opt level: O2

string * getScriptName(string *__return_storage_ptr__,string *script_path)

{
  string local_30;
  
  basename((char *)&local_30);
  dropExtension(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string getScriptName (const std::string& script_path)
{
  return dropExtension (basename (script_path));
}